

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cc
# Opt level: O1

void __thiscall wabt::sha256(wabt *this,string_view input,string *digest)

{
  uchar *puVar1;
  char *pcVar2;
  
  pcVar2 = input._M_str;
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  **(undefined1 **)pcVar2 = 0;
  std::__cxx11::string::resize((ulong)pcVar2,' ');
  puVar1 = SHA256((uchar *)input._M_len,(size_t)this,*(uchar **)pcVar2);
  if (puVar1 != (uchar *)0x0) {
    return;
  }
  abort();
}

Assistant:

void sha256(std::string_view input, std::string& digest) {
  digest.clear();

#if HAVE_OPENSSL_SHA_H
  digest.resize(SHA256_DIGEST_LENGTH);
  if (!SHA256(reinterpret_cast<const uint8_t*>(input.data()), input.size(),
              reinterpret_cast<uint8_t*>(digest.data()))) {
    // should not be possible to fail here, but check (and abort) just in case
    abort();
  }
#else
  digest.resize(picosha2::k_digest_size);
  picosha2::hash256(input, digest);
#endif
}